

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_cs_derived.cpp
# Opt level: O0

ir_variable * __thiscall
anon_unknown.dwarf_43079::lower_cs_derived_visitor::add_system_value
          (lower_cs_derived_visitor *this,int slot,glsl_type *type,char *name)

{
  ir_variable *this_00;
  exec_node *local_38;
  ir_variable *var;
  char *name_local;
  glsl_type *type_local;
  int slot_local;
  lower_cs_derived_visitor *this_local;
  
  this_00 = (ir_variable *)exec_node::operator_new(0x90,this->shader);
  ir_variable::ir_variable(this_00,type,name,ir_var_system_value);
  *(uint *)&this_00->data = *(uint *)&this_00->data & 0xfffff3ff | 0x800;
  *(uint *)&this_00->data = *(uint *)&this_00->data & 0xfffffffe | 1;
  (this_00->data).location = slot;
  *(uint *)&this_00->data = *(uint *)&this_00->data & 0xfffbffff | 0x40000;
  *(uint *)&this_00->data = *(uint *)&this_00->data & 0xfff7ffff;
  local_38 = (exec_node *)0x0;
  if (this_00 != (ir_variable *)0x0) {
    local_38 = &(this_00->super_ir_instruction).super_exec_node;
  }
  exec_list::push_head(this->shader->ir,local_38);
  return this_00;
}

Assistant:

ir_variable *
lower_cs_derived_visitor::add_system_value(
      int slot, const glsl_type *type, const char *name)
{
   ir_variable *var = new(shader) ir_variable(type, name, ir_var_system_value);
   var->data.how_declared = ir_var_declared_implicitly;
   var->data.read_only = true;
   var->data.location = slot;
   var->data.explicit_location = true;
   var->data.explicit_index = 0;
   shader->ir->push_head(var);

   return var;
}